

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpgd.cpp
# Opt level: O3

void __thiscall jpgd::jpeg_decoder::H2V2Convert(jpeg_decoder *this)

{
  byte bVar1;
  int iVar2;
  bool bVar3;
  int iVar4;
  bool bVar5;
  long lVar6;
  int iVar7;
  uint8 *puVar8;
  uint8 *puVar9;
  uint8 *puVar10;
  long lVar11;
  uint uVar12;
  int iVar13;
  uint8 *puVar14;
  uint8 *puVar15;
  uint8 *puVar16;
  int iVar17;
  ulong uVar18;
  uint8 *puVar19;
  uint8 *puVar20;
  
  if (0 < this->m_max_mcus_per_row) {
    lVar11 = (long)this->m_max_mcu_y_size - (long)this->m_mcu_lines_left;
    uVar12 = (uint)lVar11;
    lVar6 = (ulong)(uVar12 & 7) * 8 + 0x80;
    if ((int)uVar12 < 8) {
      lVar6 = lVar11 * 8;
    }
    puVar8 = this->m_pSample_buf + lVar6;
    puVar19 = this->m_pScan_line_1;
    puVar20 = this->m_pScan_line_0;
    puVar14 = this->m_pSample_buf + (long)(int)(uVar12 * 4 & 0xfffffff8) + 0x100;
    iVar4 = this->m_max_mcus_per_row;
    do {
      bVar3 = true;
      do {
        bVar5 = bVar3;
        puVar15 = puVar14;
        puVar9 = puVar8;
        uVar18 = 0xfffffffffffffffe;
        puVar8 = puVar19;
        puVar14 = puVar20;
        lVar6 = 0;
        do {
          lVar11 = lVar6;
          puVar16 = puVar14;
          puVar10 = puVar8;
          iVar7 = this->m_crr[puVar15[lVar11 + 0x40]];
          uVar12 = (uint)puVar9[lVar11 * 2];
          iVar13 = iVar7 + uVar12;
          if (iVar13 < 1) {
            iVar13 = 0;
          }
          if (0xfe < iVar13) {
            iVar13 = 0xff;
          }
          iVar17 = this->m_cbg[puVar15[lVar11]] + this->m_crg[puVar15[lVar11 + 0x40]] >> 0x10;
          iVar2 = this->m_cbb[puVar15[lVar11]];
          puVar20[lVar11 * 8] = (uint8)iVar13;
          iVar13 = iVar17 + uVar12;
          if (iVar13 < 1) {
            iVar13 = 0;
          }
          if (0xfe < iVar13) {
            iVar13 = 0xff;
          }
          puVar20[lVar11 * 8 + 1] = (uint8)iVar13;
          iVar13 = uVar12 + iVar2;
          if (iVar13 < 1) {
            iVar13 = 0;
          }
          if (0xfe < iVar13) {
            iVar13 = 0xff;
          }
          puVar20[lVar11 * 8 + 2] = (uint8)iVar13;
          puVar20[lVar11 * 8 + 3] = 0xff;
          uVar12 = (uint)puVar9[lVar11 * 2 + 1];
          iVar13 = iVar7 + uVar12;
          if (iVar13 < 1) {
            iVar13 = 0;
          }
          if (0xfe < iVar13) {
            iVar13 = 0xff;
          }
          puVar20[lVar11 * 8 + 4] = (uint8)iVar13;
          iVar13 = iVar17 + uVar12;
          if (iVar13 < 1) {
            iVar13 = 0;
          }
          if (0xfe < iVar13) {
            iVar13 = 0xff;
          }
          puVar20[lVar11 * 8 + 5] = (uint8)iVar13;
          iVar13 = uVar12 + iVar2;
          if (iVar13 < 1) {
            iVar13 = 0;
          }
          if (0xfe < iVar13) {
            iVar13 = 0xff;
          }
          puVar20[lVar11 * 8 + 6] = (uint8)iVar13;
          puVar20[lVar11 * 8 + 7] = 0xff;
          uVar12 = (uint)puVar9[lVar11 * 2 + 8];
          iVar13 = iVar7 + uVar12;
          if (iVar13 < 1) {
            iVar13 = 0;
          }
          if (0xfe < iVar13) {
            iVar13 = 0xff;
          }
          puVar19[lVar11 * 8] = (uint8)iVar13;
          iVar13 = iVar17 + uVar12;
          if (iVar13 < 1) {
            iVar13 = 0;
          }
          if (0xfe < iVar13) {
            iVar13 = 0xff;
          }
          puVar19[lVar11 * 8 + 1] = (uint8)iVar13;
          iVar13 = uVar12 + iVar2;
          if (iVar13 < 1) {
            iVar13 = 0;
          }
          if (0xfe < iVar13) {
            iVar13 = 0xff;
          }
          puVar19[lVar11 * 8 + 2] = (uint8)iVar13;
          puVar19[lVar11 * 8 + 3] = 0xff;
          bVar1 = puVar9[lVar11 * 2 + 9];
          iVar7 = iVar7 + (uint)bVar1;
          if (iVar7 < 1) {
            iVar7 = 0;
          }
          if (0xfe < iVar7) {
            iVar7 = 0xff;
          }
          puVar19[lVar11 * 8 + 4] = (uint8)iVar7;
          iVar17 = iVar17 + (uint)bVar1;
          if (iVar17 < 1) {
            iVar17 = 0;
          }
          if (0xfe < iVar17) {
            iVar17 = 0xff;
          }
          puVar19[lVar11 * 8 + 5] = (uint8)iVar17;
          iVar13 = 0;
          if (0 < (int)(iVar2 + (uint)bVar1)) {
            iVar13 = iVar2 + (uint)bVar1;
          }
          if (0xfe < iVar13) {
            iVar13 = 0xff;
          }
          puVar19[lVar11 * 8 + 6] = (uint8)iVar13;
          puVar19[lVar11 * 8 + 7] = 0xff;
          uVar18 = uVar18 + 2;
          puVar8 = puVar19 + lVar11 * 8 + 8;
          puVar14 = puVar20 + lVar11 * 8 + 8;
          lVar6 = lVar11 + 1;
        } while (uVar18 < 6);
        puVar20 = puVar16 + 8;
        puVar19 = puVar10 + 8;
        puVar8 = puVar9 + 0x40;
        puVar14 = puVar15 + lVar11 + 1;
        bVar3 = false;
      } while (bVar5);
      puVar8 = puVar9 + 0x140;
      puVar14 = puVar15 + lVar11 + 0x179;
      bVar3 = 1 < iVar4;
      iVar4 = iVar4 + -1;
    } while (bVar3);
  }
  return;
}

Assistant:

void jpeg_decoder::H2V2Convert()
	{
		int row = m_max_mcu_y_size - m_mcu_lines_left;
		uint8* d0 = m_pScan_line_0;
		uint8* d1 = m_pScan_line_1;
		uint8* y;
		uint8* c;

		if (row < 8)
			y = m_pSample_buf + row * 8;
		else
			y = m_pSample_buf + 64 * 2 + (row & 7) * 8;

		c = m_pSample_buf + 64 * 4 + (row >> 1) * 8;

		for (int i = m_max_mcus_per_row; i > 0; i--)
		{
			for (int l = 0; l < 2; l++)
			{
				for (int j = 0; j < 8; j += 2)
				{
					int cb = c[0];
					int cr = c[64];

					int rc = m_crr[cr];
					int gc = ((m_crg[cr] + m_cbg[cb]) >> 16);
					int bc = m_cbb[cb];

					int yy = y[j];
					d0[0] = clamp(yy + rc);
					d0[1] = clamp(yy + gc);
					d0[2] = clamp(yy + bc);
					d0[3] = 255;

					yy = y[j + 1];
					d0[4] = clamp(yy + rc);
					d0[5] = clamp(yy + gc);
					d0[6] = clamp(yy + bc);
					d0[7] = 255;

					yy = y[j + 8];
					d1[0] = clamp(yy + rc);
					d1[1] = clamp(yy + gc);
					d1[2] = clamp(yy + bc);
					d1[3] = 255;

					yy = y[j + 8 + 1];
					d1[4] = clamp(yy + rc);
					d1[5] = clamp(yy + gc);
					d1[6] = clamp(yy + bc);
					d1[7] = 255;

					d0 += 8;
					d1 += 8;

					c++;
				}
				y += 64;
			}

			y += 64 * 6 - 64 * 2;
			c += 64 * 6 - 8;
		}
	}